

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFunctions.h
# Opt level: O1

int luabridge::detail::CFunc::readOnlyError(lua_State *L)

{
  int iVar1;
  long *plVar2;
  long *plVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string s;
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  char *local_70;
  undefined8 local_68;
  char local_60;
  undefined7 uStack_5f;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_68 = 0;
  local_60 = '\0';
  local_b0[0] = local_a0;
  local_70 = &local_60;
  std::__cxx11::string::_M_construct<char*>((string *)local_b0,&local_60,&local_60);
  std::__cxx11::string::append((char *)local_b0);
  lua_tolstring(L,-0xf4629,(size_t *)0x0);
  plVar2 = (long *)std::__cxx11::string::append((char *)local_b0);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_80 = *plVar3;
    lStack_78 = plVar2[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar3;
    local_90 = (long *)*plVar2;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_40 = *plVar3;
    lStack_38 = plVar2[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar3;
    local_50 = (long *)*plVar2;
  }
  local_48 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  iVar1 = luaL_error(L,local_70);
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  return iVar1;
}

Assistant:

static int readOnlyError(lua_State* L)
    {
        std::string s;

        s = s + "'" + lua_tostring(L, lua_upvalueindex(1)) + "' is read-only";

        return luaL_error(L, s.c_str());
    }